

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O0

fstream * __thiscall
SharedDirectory::open_writable_file
          (fstream *__return_storage_ptr__,SharedDirectory *this,string *name)

{
  bool bVar1;
  Error *this_00;
  string local_80;
  path local_60;
  _Self local_30;
  _Self local_28;
  string *local_20;
  string *name_local;
  SharedDirectory *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  this_local = (SharedDirectory *)__return_storage_ptr__;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::find(&this->pending_files,name);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end(&this->pending_files);
  bVar1 = std::operator==(&local_28,&local_30);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_80,(string *)local_20);
    path_in_dir(&local_60,this,&local_80);
    boost::filesystem::basic_fstream<char,_std::char_traits<char>_>::basic_fstream
              (__return_storage_ptr__,&local_60,_S_out);
    boost::filesystem::path::~path(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    return __return_storage_ptr__;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(this_00,"File should be reserved first");
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

boost::filesystem::fstream SharedDirectory::open_writable_file(const std::string &name) {
  if (pending_files.find(name) == pending_files.end()) {
    throw Error("File should be reserved first");
  }
  return fstream(path_in_dir(name), std::ios::out);
}